

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

void Service_SetMonitoringMode
               (UA_Server *server,UA_Session *session,UA_SetMonitoringModeRequest *request,
               UA_SetMonitoringModeResponse *response)

{
  UA_Subscription *sub_00;
  UA_StatusCode *pUVar1;
  UA_MonitoredItem *mon_00;
  uint local_80;
  uint local_78;
  uint local_74;
  UA_MonitoredItem *mon;
  size_t i;
  UA_Subscription *sub;
  UA_SetMonitoringModeResponse *response_local;
  UA_SetMonitoringModeRequest *request_local;
  UA_Session *session_local;
  UA_Server *server_local;
  
  if (session->channel == (UA_SecureChannel *)0x0) {
    local_78 = 0;
  }
  else {
    if (session->channel->connection == (UA_Connection *)0x0) {
      local_74 = 0;
    }
    else {
      local_74 = session->channel->connection->sockfd;
    }
    local_78 = local_74;
  }
  if (session->channel == (UA_SecureChannel *)0x0) {
    local_80 = 0;
  }
  else {
    local_80 = (session->channel->securityToken).channelId;
  }
  UA_LOG_DEBUG((server->config).logger,UA_LOGCATEGORY_SESSION,
               "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Processing SetMonitoringMode"
               ,(ulong)local_78,(ulong)local_80,(ulong)(session->sessionId).identifier.numeric,
               (uint)(session->sessionId).identifier.guid.data2,
               (uint)(session->sessionId).identifier.guid.data3,
               (uint)(session->sessionId).identifier.guid.data4[0],
               (uint)(session->sessionId).identifier.guid.data4[1],
               (uint)(session->sessionId).identifier.guid.data4[2],
               (uint)(session->sessionId).identifier.guid.data4[3],
               (uint)(session->sessionId).identifier.guid.data4[4],
               (uint)(session->sessionId).identifier.guid.data4[5],
               (uint)(session->sessionId).identifier.guid.data4[6],
               (uint)(session->sessionId).identifier.guid.data4[7]);
  sub_00 = UA_Session_getSubscriptionByID(session,request->subscriptionId);
  if (sub_00 == (UA_Subscription *)0x0) {
    (response->responseHeader).serviceResult = 0x80280000;
  }
  else if (request->monitoredItemIdsSize == 0) {
    (response->responseHeader).serviceResult = 0x800f0000;
  }
  else {
    pUVar1 = (UA_StatusCode *)UA_Array_new(request->monitoredItemIdsSize,UA_TYPES + 0x12);
    response->results = pUVar1;
    if (response->results == (UA_StatusCode *)0x0) {
      (response->responseHeader).serviceResult = 0x80030000;
    }
    else {
      response->resultsSize = request->monitoredItemIdsSize;
      for (mon = (UA_MonitoredItem *)0x0; mon < (UA_MonitoredItem *)response->resultsSize;
          mon = (UA_MonitoredItem *)((long)&(mon->listEntry).le_next + 1)) {
        mon_00 = UA_Subscription_getMonitoredItem(sub_00,request->monitoredItemIds[(long)mon]);
        if (mon_00 == (UA_MonitoredItem *)0x0) {
          response->results[(long)mon] = 0x80420000;
        }
        else if (request->monitoringMode != mon_00->monitoringMode) {
          mon_00->monitoringMode = request->monitoringMode;
          if (mon_00->monitoringMode == UA_MONITORINGMODE_REPORTING) {
            MonitoredItem_registerSampleJob(server,mon_00);
          }
          else {
            MonitoredItem_unregisterSampleJob(server,mon_00);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Service_SetMonitoringMode(UA_Server *server, UA_Session *session,
                               const UA_SetMonitoringModeRequest *request,
                               UA_SetMonitoringModeResponse *response) {
    UA_LOG_DEBUG_SESSION(server->config.logger, session, "Processing SetMonitoringMode");
    UA_Subscription *sub = UA_Session_getSubscriptionByID(session, request->subscriptionId);
    if(!sub) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADSUBSCRIPTIONIDINVALID;
        return;
    }

    if(request->monitoredItemIdsSize == 0) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADNOTHINGTODO;
        return;
    }

    response->results = UA_Array_new(request->monitoredItemIdsSize, &UA_TYPES[UA_TYPES_STATUSCODE]);
    if(!response->results) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADOUTOFMEMORY;
        return;
    }
    response->resultsSize = request->monitoredItemIdsSize;

    for(size_t i = 0; i < response->resultsSize; ++i) {
        UA_MonitoredItem *mon =
            UA_Subscription_getMonitoredItem(sub, request->monitoredItemIds[i]);
        if(!mon) {
            response->results[i] = UA_STATUSCODE_BADMONITOREDITEMIDINVALID;
            continue;
        }
        if(request->monitoringMode == mon->monitoringMode)
            continue;
        mon->monitoringMode = request->monitoringMode;
        if(mon->monitoringMode == UA_MONITORINGMODE_REPORTING)
            MonitoredItem_registerSampleJob(server, mon);
        else
            MonitoredItem_unregisterSampleJob(server, mon);
    }
}